

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O3

Instrument *
Timidity::load_instrument
          (Renderer *song,char *name,int percussion,int panning,int note_to_use,int strip_loop,
          int strip_envelope,int strip_tail)

{
  float fVar1;
  sample_t sVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  WORD WVar6;
  int iVar7;
  undefined4 uVar8;
  int iVar9;
  FileReader *pFVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Instrument *this;
  undefined4 extraout_var_02;
  long lVar11;
  sample_t *psVar12;
  undefined4 extraout_var_03;
  ulong uVar13;
  undefined1 *puVar14;
  char cVar15;
  char *pcVar16;
  int iVar17;
  sample_t *psVar18;
  uint uVar19;
  Sample *sp;
  undefined1 auVar20 [16];
  GF1PatchData patch_data;
  GF1LayerData layer_data;
  FString local_1d8;
  int local_1cc;
  ulong local_1c8;
  long local_1c0;
  int local_1b8;
  int local_1b4;
  Sample *local_1b0;
  undefined1 *local_1a8;
  undefined1 local_1a0 [7];
  byte local_199;
  SDWORD local_198;
  undefined8 local_194;
  ushort local_18c;
  int local_18a;
  int local_186;
  int local_182;
  byte local_17c;
  undefined4 local_17b;
  undefined2 local_177;
  byte local_175 [10];
  byte local_16b;
  byte local_16a;
  byte local_169;
  SWORD local_168;
  ushort local_166;
  ulong local_140;
  int local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined1 local_11f [6];
  byte local_119;
  long local_f0;
  uint local_e8;
  byte abStack_da [60];
  byte local_9e [47];
  undefined1 local_6f [22];
  byte local_59;
  long lVar21;
  
  if (name == (char *)0x0) {
    return (Instrument *)0x0;
  }
  local_1b4 = note_to_use;
  pFVar10 = PathExpander::openFileReader((PathExpander *)pathExpander,name,(int *)0x0);
  if (pFVar10 == (FileReader *)0x0) {
    FString::FString(&local_1d8,name);
    FString::operator+=(&local_1d8,".pat");
    pFVar10 = PathExpander::openFileReader((PathExpander *)pathExpander,local_1d8.Chars,(int *)0x0);
    if (pFVar10 == (FileReader *)0x0) {
      FString::ToUpper(&local_1d8);
      pFVar10 = PathExpander::openFileReader
                          ((PathExpander *)pathExpander,local_1d8.Chars,(int *)0x0);
      FString::~FString(&local_1d8);
      if (pFVar10 == (FileReader *)0x0) {
        cmsg(2,0,"Instrument `%s\' can\'t be found.\n",name);
        return (Instrument *)0x0;
      }
    }
    else {
      FString::~FString(&local_1d8);
    }
  }
  cmsg(0,2,"Loading instrument %s\n",name);
  iVar7 = (*(pFVar10->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar10,&local_f0,0x81);
  if (CONCAT44(extraout_var,iVar7) != 0x81) goto LAB_00350870;
  if (local_f0 == 0x4843544150314647) {
    if ((local_e8 >> 0x18 | (local_e8 & 0xff0000) >> 8 | (local_e8 & 0xff00) << 8 | local_e8 << 0x18
        ) < 0x31313000) {
      pcVar16 = "%s: Is an old and unsupported patch version.\n";
    }
    else {
      iVar7 = (*(pFVar10->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar10,local_6f,0x3f);
      if (CONCAT44(extraout_var_00,iVar7) == 0x3f) {
        if (local_9e[0] < 2) {
          if (local_59 < 2) {
            iVar7 = (*(pFVar10->super_FileReaderBase)._vptr_FileReaderBase[2])
                              (pFVar10,local_11f,0x2f);
            if (CONCAT44(extraout_var_01,iVar7) == 0x2f) {
              if (local_119 == 0) {
                this = (Instrument *)0x0;
                cmsg(2,0,"Instrument has 0 samples.\n");
              }
              else {
                uVar19 = (uint)local_119;
                local_1cc = strip_loop;
                this = (Instrument *)operator_new(0x10);
                this->sample = (Sample *)0x0;
                this->samples = uVar19;
                local_1b0 = (Sample *)safe_malloc((ulong)uVar19 * 0x68);
                this->sample = local_1b0;
                memset(local_1b0,0,(ulong)local_119 * 0x68);
                if (local_119 != 0) {
                  local_140 = (ulong)((percussion & 0x7fU) * 1000) / 0x7f;
                  puVar14 = (undefined1 *)((long)&local_1b0->envelope + 6);
                  local_1c8 = 0;
                  local_138 = -0x80000000;
                  uStack_134 = 0x80000000;
                  uStack_130 = 0x80000000;
                  uStack_12c = 0x80000000;
                  local_1b8 = percussion;
                  do {
                    local_1a8 = puVar14;
                    iVar7 = (*(pFVar10->super_FileReaderBase)._vptr_FileReaderBase[2])
                                      (pFVar10,local_1a0,0x60);
                    if (CONCAT44(extraout_var_02,iVar7) != 0x60) goto LAB_003508b0;
                    local_1b0[local_1c8].data_length = local_198;
                    local_1b0[local_1c8].loop_start = (undefined4)local_194;
                    local_1b0[local_1c8].loop_end = local_194._4_4_;
                    local_1b0[local_1c8].sample_rate = (uint)local_18c;
                    local_1b0[local_1c8].low_freq = (float)local_18a;
                    local_1b0[local_1c8].high_freq = (float)local_186 + 0.9999;
                    local_1b0[local_1c8].root_freq = (float)local_182;
                    local_1b0[local_1c8].high_vel = '\x7f';
                    local_1b0[local_1c8].type = '\0';
                    local_1b0[local_1c8].velocity = -1;
                    uVar5 = (ushort)local_140;
                    if (local_1b8 == -1) {
                      uVar5 = (ushort)(((local_17c & 0xf) * 1000) / 0xf);
                    }
                    sp = local_1b0 + local_1c8;
                    sp->panning = uVar5 - 500;
                    Renderer::compute_pan
                              ((double)uVar5 * 0.001,0,&sp->left_offset,&sp->right_offset);
                    if (local_175[8] == 0 || local_175[7] == 0) {
                      sp->tremolo_sweep_increment = 0;
                      sp->tremolo_phase_increment = 0;
                      sp->tremolo_depth = '\0';
                      cmsg(0,3," * no tremolo\n");
                    }
                    else {
                      iVar7 = song->control_ratio;
                      fVar1 = song->rate;
                      if (local_175[6] == 0) {
                        uVar13 = 0;
                      }
                      else {
                        uVar13 = (ulong)(uint)(int)((float)(iVar7 * 0x260000) /
                                                   ((float)local_175[6] * fVar1));
                      }
                      sp->tremolo_sweep_increment = (SDWORD)uVar13;
                      uVar19 = (uint)((float)(int)((uint)local_175[7] * iVar7 * 0x20) /
                                     (fVar1 * 38.0));
                      sp->tremolo_phase_increment = uVar19;
                      sp->tremolo_depth = local_175[8];
                      cmsg(0,3," * tremolo: sweep %d, phase %d, depth %d\n",uVar13,(ulong)uVar19,
                           (ulong)local_175[8]);
                    }
                    if (local_16a == 0 || local_16b == 0) {
                      sp->vibrato_sweep_increment = 0;
                      sp->vibrato_control_ratio = 0;
                      sp->vibrato_depth = '\0';
                      cmsg(0,3," * no vibrato\n");
                    }
                    else {
                      fVar1 = song->rate;
                      uVar19 = (uint)((fVar1 * 38.0) / (float)((uint)local_16b << 6));
                      sp->vibrato_control_ratio = uVar19;
                      if (local_175[9] == 0) {
                        uVar13 = 0;
                      }
                      else {
                        uVar13 = (ulong)(uint)(int)(((float)(int)uVar19 * 2490368.0) /
                                                   (fVar1 * (float)local_175[9]));
                      }
                      sp->vibrato_sweep_increment = (SDWORD)uVar13;
                      sp->vibrato_depth = local_16a;
                      cmsg(0,3," * vibrato: sweep %d, ctl %d, depth %d\n",uVar13,(ulong)uVar19,
                           (ulong)local_16a);
                    }
                    sp->modes = (ushort)local_169;
                    if (panning == -1) {
                      sp->scale_note = local_168;
                      sp->scale_factor = local_166;
                      if (local_166 < 3) {
                        sp->scale_factor = local_166 << 10;
                        WVar6 = local_166 << 10;
                      }
                      else {
                        WVar6 = local_166;
                        if (0x800 < local_166) {
                          sp->scale_factor = 0x400;
                          goto LAB_003504a4;
                        }
                      }
                      if (WVar6 != 0x400) {
                        cmsg(0,3," * Scale: note %d, factor %d\n");
                      }
                    }
                    else {
                      sp->scale_note = (SWORD)panning;
                      sp->scale_factor = 0;
                    }
LAB_003504a4:
                    lVar11 = -0x3c;
                    do {
                      if (local_9e[lVar11] != 0) {
                        uVar8 = 0;
                        goto LAB_003504c5;
                      }
                      lVar11 = lVar11 + 1;
                    } while (lVar11 != 0);
                    uVar8 = 1;
LAB_003504c5:
                    if (((local_1b4 == 1) && ((sp->modes & 0x3c) != 0)) &&
                       (cmsg(0,3," - Removing loop and/or sustain\n"), (char)uVar8 != '\0')) {
                      *(byte *)&sp->modes = (byte)sp->modes & 0xc3;
                      if (local_1cc == 1) {
                        cmsg(0,3," - Removing envelope\n");
LAB_003505a8:
                        lVar11 = 0;
                        bVar4 = local_175[0];
                        do {
                          bVar3 = local_175[lVar11 + 1];
                          if (bVar4 < bVar3) {
                            local_175[0] = bVar3;
                            bVar4 = bVar3;
                          }
                          lVar11 = lVar11 + 1;
                        } while (lVar11 != 5);
                        local_177 = 0x3f3f;
                        local_17b = 0x3f3f3f3f;
                        lVar11 = 0;
                        auVar20 = _DAT_0073b2f0;
                        do {
                          if (SUB164(auVar20 ^ _DAT_0073b300,4) == local_138 &&
                              SUB164(auVar20 ^ _DAT_0073b300,0) < -0x7ffffffa) {
                            local_175[lVar11] = bVar4;
                            local_175[lVar11 + 1] = bVar4;
                          }
                          lVar11 = lVar11 + 2;
                          lVar21 = auVar20._8_8_;
                          auVar20._0_8_ = auVar20._0_8_ + 2;
                          auVar20._8_8_ = lVar21 + 2;
                        } while (lVar11 != 6);
                      }
                    }
                    else if (local_1cc == 1) {
                      local_1c0 = CONCAT44(local_1c0._4_4_,uVar8);
                      cmsg(0,3," - Removing envelope\n");
                      if ((char)local_1c0 != '\0') goto LAB_003505a8;
                    }
                    lVar11 = -6;
                    do {
                      local_1a8[lVar11] = local_175[lVar11];
                      bVar4 = local_175[lVar11 + 6];
                      if (0xfa < bVar4) {
                        bVar4 = 0xfb;
                      }
                      if (bVar4 < 6) {
                        bVar4 = 5;
                      }
                      local_1a8[lVar11 + 6] = bVar4;
                      lVar11 = lVar11 + 1;
                    } while (lVar11 != 0);
                    iVar7 = sp->data_length;
                    if ((sp->modes & 1) == 0) {
                      if (0x100000 < iVar7) goto LAB_003508b0;
                    }
                    else if (0x200001 < iVar7) goto LAB_003508b0;
                    psVar12 = (sample_t *)safe_malloc((long)iVar7);
                    sp->data = psVar12;
                    local_1c0 = (long)sp->data_length;
                    iVar7 = (*(pFVar10->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar10);
                    if (CONCAT44(extraout_var_03,iVar7) != local_1c0) {
LAB_003508b0:
                      cmsg(2,0,"Error reading sample %d.\n",local_1c8);
                      Instrument::~Instrument(this);
                      operator_delete(this,0x10);
                      (*(pFVar10->super_FileReaderBase)._vptr_FileReaderBase[1])(pFVar10);
                      return (Instrument *)0x0;
                    }
                    convert_sample_data(sp,sp->data);
                    if ((sp->modes & 0x10) == 0) {
                      iVar7 = sp->data_length;
                      iVar17 = sp->loop_start;
                      iVar9 = sp->loop_end;
                      cVar15 = (char)((sp->modes & 4) >> 2);
                    }
                    else {
                      cmsg(1,0,"Reverse loop in %s\n",name);
                      psVar12 = sp->data;
                      iVar7 = sp->data_length;
                      if (2 < iVar7 + 1U) {
                        psVar18 = psVar12 + iVar7;
                        lVar11 = 0;
                        do {
                          sVar2 = psVar12[lVar11];
                          psVar12[lVar11] = *psVar18;
                          *psVar18 = sVar2;
                          psVar18 = psVar18 + -1;
                          lVar11 = lVar11 + 1;
                        } while (iVar7 / 2 != (int)lVar11);
                      }
                      psVar12[iVar7] = psVar12[(long)iVar7 + -1];
                      iVar17 = iVar7 - sp->loop_end;
                      iVar9 = iVar7 - sp->loop_start;
                      sp->loop_start = iVar17;
                      sp->loop_end = iVar9;
                      sp->modes = sp->modes & 0xffeb | 4;
                      cVar15 = '\x01';
                    }
                    sp->data_length = iVar7 << 0xc;
                    sp->loop_start = (local_199 & 0xf) << 8 | iVar17 << 0xc;
                    sp->loop_end = (local_199 & 0xfffffff0) << 4 | iVar9 << 0xc;
                    if (sp->scale_factor == 0 && cVar15 == '\0') {
                      pre_resample(song,sp);
                    }
                    if (strip_envelope == 1) {
                      cmsg(0,3," - Stripping tail\n");
                      sp->data_length = sp->loop_end;
                    }
                    local_1c8 = local_1c8 + 1;
                    puVar14 = local_1a8 + 0x68;
                  } while (local_1c8 < local_119);
                }
              }
              goto LAB_0035088b;
            }
            goto LAB_00350870;
          }
          pcVar16 = "Can\'t handle instruments with %d layers.\n";
        }
        else {
          pcVar16 = "Can\'t handle patches with %d instruments.\n";
        }
        this = (Instrument *)0x0;
        cmsg(2,0,pcVar16);
        goto LAB_0035088b;
      }
LAB_00350870:
      pcVar16 = "%s: Error reading instrument.\n";
    }
  }
  else {
    pcVar16 = "%s: Not an instrument.\n";
  }
  this = (Instrument *)0x0;
  cmsg(2,0,pcVar16,name);
LAB_0035088b:
  (*(pFVar10->super_FileReaderBase)._vptr_FileReaderBase[1])(pFVar10);
  return this;
}

Assistant:

static Instrument *load_instrument(Renderer *song, const char *name, int percussion,
					int panning, int note_to_use,
					int strip_loop, int strip_envelope,
					int strip_tail)
{
	Instrument *ip;
	Sample *sp;
	FileReader *fp;
	GF1PatchHeader header;
	GF1InstrumentData idata;
	GF1LayerData layer_data;
	GF1PatchData patch_data;
	int i, j;
	bool noluck = false;

	if (!name) return 0;

	/* Open patch file */
	if ((fp = pathExpander.openFileReader(name, NULL)) == NULL)
	{
		/* Try with various extensions */
		FString tmp = name;
		tmp += ".pat";
		if ((fp = pathExpander.openFileReader(tmp, NULL)) == NULL)
		{
#ifdef __unix__			// Windows isn't case-sensitive.
			tmp.ToUpper();
			if ((fp = pathExpander.openFileReader(tmp, NULL)) == NULL)
#endif
			{
				noluck = true;
			}
		}
	}

	if (noluck)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Instrument `%s' can't be found.\n", name);
		return 0;
	}

	cmsg(CMSG_INFO, VERB_NOISY, "Loading instrument %s\n", name);

	/* Read some headers and do cursory sanity checks. */

	if (sizeof(header) != fp->Read(&header, sizeof(header)))
	{
failread:
		cmsg(CMSG_ERROR, VERB_NORMAL, "%s: Error reading instrument.\n", name);
		delete fp;
		return 0;
	}
	if (strncmp(header.Header, GF1_HEADER_TEXT, HEADER_SIZE - 4) != 0)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "%s: Not an instrument.\n", name);
		delete fp;
		return 0;
	}
	if (strcmp(header.Header + 8, "110") < 0)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "%s: Is an old and unsupported patch version.\n", name);
		delete fp;
		return 0;
	}
	if (sizeof(idata) != fp->Read(&idata, sizeof(idata)))
	{
		goto failread;
	}

	header.WaveForms = LittleShort(header.WaveForms);
	header.MasterVolume = LittleShort(header.MasterVolume);
	header.DataSize = LittleLong(header.DataSize);
	idata.Instrument = LittleShort(idata.Instrument);

	if (header.Instruments != 1 && header.Instruments != 0) /* instruments. To some patch makers, 0 means 1 */
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Can't handle patches with %d instruments.\n", header.Instruments);
		delete fp;
		return 0;
	}

	if (idata.Layers != 1 && idata.Layers != 0) /* layers. What's a layer? */
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Can't handle instruments with %d layers.\n", idata.Layers);
		delete fp;
		return 0;
	}

	if (sizeof(layer_data) != fp->Read(&layer_data, sizeof(layer_data)))
	{
		goto failread;
	}

	if (layer_data.Samples == 0)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Instrument has 0 samples.\n");
		delete fp;
		return 0;
	}

	ip = new Instrument;
	ip->samples = layer_data.Samples;
	ip->sample = (Sample *)safe_malloc(sizeof(Sample) * layer_data.Samples);
	memset(ip->sample, 0, sizeof(Sample) * layer_data.Samples);
	for (i = 0; i < layer_data.Samples; ++i)
	{
		if (sizeof(patch_data) != fp->Read(&patch_data, sizeof(patch_data)))
		{
fail:
			cmsg(CMSG_ERROR, VERB_NORMAL, "Error reading sample %d.\n", i);
			delete ip;
			delete fp;
			return 0;
		}

		sp = &(ip->sample[i]);

		sp->data_length = LittleLong(patch_data.WaveSize);
		sp->loop_start = LittleLong(patch_data.StartLoop);
		sp->loop_end = LittleLong(patch_data.EndLoop);
		sp->sample_rate = LittleShort(patch_data.SampleRate);
		sp->low_freq = float(LittleLong(patch_data.LowFrequency));
		sp->high_freq = float(LittleLong(patch_data.HighFrequency)) + 0.9999f;
		sp->root_freq = float(LittleLong(patch_data.RootFrequency));
		sp->high_vel = 127;
		sp->velocity = -1;
		sp->type = INST_GUS;

		// Expand to SF2 range.
		if (panning == -1)
		{
			sp->panning = (patch_data.Balance & 0x0F) * 1000 / 15 - 500;
		}
		else
		{
			sp->panning = (panning & 0x7f) * 1000 / 127 - 500;
		}
		song->compute_pan((sp->panning + 500) / 1000.0, INST_GUS, sp->left_offset, sp->right_offset);

		/* tremolo */
		if (patch_data.TremoloRate == 0 || patch_data.TremoloDepth == 0)
		{
			sp->tremolo_sweep_increment = 0;
			sp->tremolo_phase_increment = 0;
			sp->tremolo_depth = 0;
			cmsg(CMSG_INFO, VERB_DEBUG, " * no tremolo\n");
		}
		else
		{
			sp->tremolo_sweep_increment = convert_tremolo_sweep(song, patch_data.TremoloSweep);
			sp->tremolo_phase_increment = convert_tremolo_rate(song, patch_data.TremoloRate);
			sp->tremolo_depth = patch_data.TremoloDepth;
			cmsg(CMSG_INFO, VERB_DEBUG, " * tremolo: sweep %d, phase %d, depth %d\n",
				sp->tremolo_sweep_increment, sp->tremolo_phase_increment, sp->tremolo_depth);
		}

		/* vibrato */
		if (patch_data.VibratoRate == 0 || patch_data.VibratoDepth == 0)
		{
			sp->vibrato_sweep_increment = 0;
			sp->vibrato_control_ratio = 0;
			sp->vibrato_depth = 0;
			cmsg(CMSG_INFO, VERB_DEBUG, " * no vibrato\n");
		}
		else
		{
			sp->vibrato_control_ratio = convert_vibrato_rate(song, patch_data.VibratoRate);
			sp->vibrato_sweep_increment = convert_vibrato_sweep(song, patch_data.VibratoSweep, sp->vibrato_control_ratio);
			sp->vibrato_depth = patch_data.VibratoDepth;
			cmsg(CMSG_INFO, VERB_DEBUG, " * vibrato: sweep %d, ctl %d, depth %d\n",
				sp->vibrato_sweep_increment, sp->vibrato_control_ratio, sp->vibrato_depth);
		}

		sp->modes = patch_data.Modes;

		/* Mark this as a fixed-pitch instrument if such a deed is desired. */
		if (note_to_use != -1)
		{
			sp->scale_note = note_to_use;
			sp->scale_factor = 0;
		}
		else
		{
			sp->scale_note = LittleShort(patch_data.ScaleFrequency);
			sp->scale_factor = LittleShort(patch_data.ScaleFactor);
			if (sp->scale_factor <= 2)
			{
				sp->scale_factor *= 1024;
			}
			else if (sp->scale_factor > 2048)
			{
				sp->scale_factor = 1024;
			}
			if (sp->scale_factor != 1024)
			{
				cmsg(CMSG_INFO, VERB_DEBUG, " * Scale: note %d, factor %d\n",
					sp->scale_note, sp->scale_factor);
			}
		}

#if 0
		/* seashore.pat in the Midia patch set has no Sustain. I don't
		   understand why, and fixing it by adding the Sustain flag to
		   all looped patches probably breaks something else. We do it
		   anyway. */

		if (sp->modes & PATCH_LOOPEN) 
		{
			sp->modes |= PATCH_SUSTAIN;
		}
#endif
		/* [RH] Alas, eawpats has percussion instruments with bad envelopes. :(
		 * (See cymchina.pat for one example of this sadness.)
		 * Do this logic for instruments without a description, only. Hopefully that
		 * catches all the patches that need it without including any extra.
		 */
		for (j = 0; j < DESC_SIZE; ++j)
		{
			if (header.Description[j] != 0)
				break;
		}
		/* Strip any loops and envelopes we're permitted to */
		/* [RH] (But PATCH_BACKWARD isn't a loop flag at all!) */
		if ((strip_loop == 1) && 
			(sp->modes & (PATCH_SUSTAIN | PATCH_LOOPEN | PATCH_BIDIR | PATCH_BACKWARD)))
		{
			cmsg(CMSG_INFO, VERB_DEBUG, " - Removing loop and/or sustain\n");
			if (j == DESC_SIZE)
			{
				sp->modes &= ~(PATCH_SUSTAIN | PATCH_LOOPEN | PATCH_BIDIR | PATCH_BACKWARD);
			}
		}

		if (strip_envelope == 1)
		{
			cmsg(CMSG_INFO, VERB_DEBUG, " - Removing envelope\n");
			/* [RH] The envelope isn't really removed, but this is the way the standard
			 * Gravis patches get that effect: All rates at maximum, and all offsets at
			 * a constant level.
			 */
			if (j == DESC_SIZE)
			{
				int k;
				for (k = 1; k < ENVELOPES; ++k)
				{ /* Find highest offset. */
					if (patch_data.EnvelopeOffset[k] > patch_data.EnvelopeOffset[0])
					{
						patch_data.EnvelopeOffset[0] = patch_data.EnvelopeOffset[k];
					}
				}
				for (k = 0; k < ENVELOPES; ++k)
				{
					patch_data.EnvelopeRate[k] = 63;
					patch_data.EnvelopeOffset[k] = patch_data.EnvelopeOffset[0];
				}
			}
		}

		for (j = 0; j < 6; j++)
		{
			sp->envelope.gf1.rate[j] = patch_data.EnvelopeRate[j];
			/* [RH] GF1NEW clamps the offsets to the range [5,251], so we do too. */
			sp->envelope.gf1.offset[j] = clamp<BYTE>(patch_data.EnvelopeOffset[j], 5, 251);
		}

		/* Then read the sample data */
		if (((sp->modes & PATCH_16) && sp->data_length/2 > MAX_SAMPLE_SIZE) ||
			(!(sp->modes & PATCH_16) && sp->data_length > MAX_SAMPLE_SIZE))
		{
			goto fail;
		}
		sp->data = (sample_t *)safe_malloc(sp->data_length);

		if (sp->data_length != fp->Read(sp->data, sp->data_length))
			goto fail;

		convert_sample_data(sp, sp->data);

		/* Reverse reverse loops and pass them off as normal loops */
		if (sp->modes & PATCH_BACKWARD)
		{
			int t;
			/* The GUS apparently plays reverse loops by reversing the
			   whole sample. We do the same because the GUS does not SUCK. */

			cmsg(CMSG_WARNING, VERB_NORMAL, "Reverse loop in %s\n", name);
			reverse_data((sample_t *)sp->data, 0, sp->data_length);
			sp->data[sp->data_length] = sp->data[sp->data_length - 1];

			t = sp->loop_start;
			sp->loop_start = sp->data_length - sp->loop_end;
			sp->loop_end = sp->data_length - t;

			sp->modes &= ~PATCH_BACKWARD;
			sp->modes |= PATCH_LOOPEN; /* just in case */
		}

		/* Then fractional samples */
		sp->data_length <<= FRACTION_BITS;
		sp->loop_start <<= FRACTION_BITS;
		sp->loop_end <<= FRACTION_BITS;

		/* Adjust for fractional loop points. */
		sp->loop_start |= (patch_data.Fractions & 0x0F) << (FRACTION_BITS-4);
		sp->loop_end   |= (patch_data.Fractions & 0xF0) << (FRACTION_BITS-4-4);

		/* If this instrument will always be played on the same note,
		   and it's not looped, we can resample it now. */
		if (sp->scale_factor == 0 && !(sp->modes & PATCH_LOOPEN))
		{
			pre_resample(song, sp);
		}

		if (strip_tail == 1)
		{
			/* Let's not really, just say we did. */
			cmsg(CMSG_INFO, VERB_DEBUG, " - Stripping tail\n");
			sp->data_length = sp->loop_end;
		}
	}
	delete fp;
	return ip;
}